

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QLayoutItem_*>::QList(QList<QLayoutItem_*> *this,qsizetype size,parameter_type t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QLayoutItem **where;
  QLayoutItem **ppQVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppQVar3 = (QLayoutItem **)QArrayData::allocate(&local_30,8,0x10,size,KeepSize);
  (this->d).d = (Data *)local_30;
  (this->d).ptr = ppQVar3;
  (this->d).size = 0;
  if (size != 0) {
    (this->d).size = size;
    auVar2 = _DAT_00660670;
    auVar1 = _DAT_00660660;
    lVar5 = size + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_00660670;
    do {
      auVar7._8_4_ = (int)uVar4;
      auVar7._0_8_ = uVar4;
      auVar7._12_4_ = (int)(uVar4 >> 0x20);
      auVar7 = (auVar7 | auVar1) ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                  auVar6._4_4_ < auVar7._4_4_) & 1)) {
        ppQVar3[uVar4] = t;
      }
      if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
          auVar7._12_4_ <= auVar6._12_4_) {
        ppQVar3[uVar4 + 1] = t;
      }
      uVar4 = uVar4 + 2;
    } while ((size + 1U & 0xfffffffffffffffe) != uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QList(qsizetype size, parameter_type t)
        : d(size)
    {
        if (size)
            d->copyAppend(size, t);
    }